

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O0

JL_STATUS JlCreateNumberS64Object(int64_t NumberS64,JlDataObject **pNumberObject)

{
  JlDataObject *local_28;
  JlDataObject *numberObject;
  JlDataObject **ppJStack_18;
  JL_STATUS jlStatus;
  JlDataObject **pNumberObject_local;
  int64_t NumberS64_local;
  
  local_28 = (JlDataObject *)0x0;
  if (pNumberObject == (JlDataObject **)0x0) {
    numberObject._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pNumberObject = (JlDataObject *)0x0;
    ppJStack_18 = pNumberObject;
    pNumberObject_local = (JlDataObject **)NumberS64;
    numberObject._4_4_ = JlCreateObject(JL_DATA_TYPE_NUMBER,&local_28);
    if (numberObject._4_4_ == JL_STATUS_SUCCESS) {
      numberObject._4_4_ = JlSetObjectNumberS64(local_28,(int64_t)pNumberObject_local);
      if (numberObject._4_4_ == JL_STATUS_SUCCESS) {
        *ppJStack_18 = local_28;
      }
      else {
        JlFreeObjectTree(&local_28);
      }
    }
  }
  return numberObject._4_4_;
}

Assistant:

JL_STATUS
    JlCreateNumberS64Object
    (
        int64_t             NumberS64,          // [in]
        JlDataObject**      pNumberObject       // [out]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* numberObject = NULL;

    if( NULL != pNumberObject )
    {
        *pNumberObject = NULL;

        jlStatus = JlCreateObject( JL_DATA_TYPE_NUMBER, &numberObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlSetObjectNumberS64( numberObject, NumberS64 );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pNumberObject = numberObject;
            }
            else
            {
                JlFreeObjectTree( &numberObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}